

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetLocalNote(RTPSession *this,void *s,size_t len)

{
  int status;
  size_t len_local;
  void *s_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTCPPacketBuilder::SetLocalNote(&this->rtcpbuilder,s,len);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetLocalNote(const void *s,size_t len)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	BUILDER_LOCK
	status = rtcpbuilder.SetLocalNote(s,len);
	BUILDER_UNLOCK
	return status;
}